

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O0

sc_signed * sc_dt::operator&(sc_signed *u,uint64 v)

{
  long in_RDX;
  long in_RSI;
  sc_signed *in_RDI;
  small_type in_stack_00000014;
  sc_digit *in_stack_00000018;
  int in_stack_00000024;
  int in_stack_00000028;
  sc_digit vd [3];
  small_type vs;
  sc_digit *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  sc_digit *in_stack_ffffffffffffffb8;
  sc_signed *psVar1;
  sc_signed *in_stack_ffffffffffffffd0;
  sc_length_param local_1c [7];
  
  if ((*(int *)(in_RSI + 8) == 0) || (in_RDX == 0)) {
    sc_length_param::sc_length_param
              ((sc_length_param *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    sc_length_param::len(local_1c);
    sc_signed::sc_signed(in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
    psVar1 = in_RDI;
  }
  else {
    psVar1 = in_RDI;
    get_sign<unsigned_long_long>
              ((unsigned_long_long *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    from_uint<unsigned_long_long>
              ((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffb8,
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    and_signed_friend(vd[0],in_stack_00000028,in_stack_00000024,in_stack_00000018,in_stack_00000014,
                      (int)v,(int)u,in_stack_00000050);
  }
  return psVar1;
}

Assistant:

sc_signed
operator&(const sc_signed& u, uint64 v)
{

  if ((u.sgn == SC_ZERO) || (v == 0)) // case 1
    return sc_signed();

  CONVERT_INT64(v);

  // other cases
  return and_signed_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                           vs, BITS_PER_UINT64, DIGITS_PER_UINT64, vd);

}